

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeSetStringSpan::UnicodeSetStringSpan
          (UnicodeSetStringSpan *this,UnicodeSetStringSpan *otherStringSpan,
          UVector *newParentSetStrings)

{
  int32_t iVar1;
  int iVar2;
  undefined4 extraout_var;
  int32_t *piVar3;
  void *__child_stack;
  UnicodeSet *o;
  void *in_R8;
  int32_t allocSize;
  int32_t stringsLength;
  UVector *newParentSetStrings_local;
  UnicodeSetStringSpan *otherStringSpan_local;
  UnicodeSetStringSpan *this_local;
  
  o = &otherStringSpan->spanSet;
  UnicodeSet::UnicodeSet(&this->spanSet,o);
  this->pSpanNotSet = (UnicodeSet *)0x0;
  this->strings = newParentSetStrings;
  this->utf8Lengths = (int32_t *)0x0;
  this->spanLengths = (uint8_t *)0x0;
  this->utf8 = (uint8_t *)0x0;
  this->utf8Length = otherStringSpan->utf8Length;
  this->maxLength16 = otherStringSpan->maxLength16;
  this->maxLength8 = otherStringSpan->maxLength8;
  this->all = '\x01';
  if (otherStringSpan->pSpanNotSet == &otherStringSpan->spanSet) {
    this->pSpanNotSet = &this->spanSet;
  }
  else {
    iVar2 = UnicodeSet::clone(otherStringSpan->pSpanNotSet,(__fn *)o,__child_stack,
                              (int)&otherStringSpan->spanSet,in_R8);
    this->pSpanNotSet = (UnicodeSet *)CONCAT44(extraout_var,iVar2);
  }
  iVar1 = UVector::size(this->strings);
  iVar2 = iVar1 * 8 + this->utf8Length;
  if (iVar2 < 0x81) {
    this->utf8Lengths = this->staticLengths;
  }
  else {
    piVar3 = (int32_t *)uprv_malloc_63((long)iVar2);
    this->utf8Lengths = piVar3;
    if (this->utf8Lengths == (int32_t *)0x0) {
      this->maxLength8 = 0;
      this->maxLength16 = 0;
      return;
    }
  }
  this->spanLengths = (uint8_t *)(this->utf8Lengths + iVar1);
  this->utf8 = this->spanLengths + (iVar1 << 2);
  memcpy(this->utf8Lengths,otherStringSpan->utf8Lengths,(long)iVar2);
  return;
}

Assistant:

UnicodeSetStringSpan::UnicodeSetStringSpan(const UnicodeSetStringSpan &otherStringSpan,
                                           const UVector &newParentSetStrings)
        : spanSet(otherStringSpan.spanSet), pSpanNotSet(NULL), strings(newParentSetStrings),
          utf8Lengths(NULL), spanLengths(NULL), utf8(NULL),
          utf8Length(otherStringSpan.utf8Length),
          maxLength16(otherStringSpan.maxLength16), maxLength8(otherStringSpan.maxLength8),
          all(TRUE) {
    if(otherStringSpan.pSpanNotSet==&otherStringSpan.spanSet) {
        pSpanNotSet=&spanSet;
    } else {
        pSpanNotSet=(UnicodeSet *)otherStringSpan.pSpanNotSet->clone();
    }

    // Allocate a block of meta data.
    // UTF-8 lengths, 4 sets of span lengths, UTF-8 strings.
    int32_t stringsLength=strings.size();
    int32_t allocSize=stringsLength*(4+1+1+1+1)+utf8Length;
    if(allocSize<=(int32_t)sizeof(staticLengths)) {
        utf8Lengths=staticLengths;
    } else {
        utf8Lengths=(int32_t *)uprv_malloc(allocSize);
        if(utf8Lengths==NULL) {
            maxLength16=maxLength8=0;  // Prevent usage by making needsStringSpanUTF16/8() return FALSE.
            return;  // Out of memory.
        }
    }

    spanLengths=(uint8_t *)(utf8Lengths+stringsLength);
    utf8=spanLengths+stringsLength*4;
    uprv_memcpy(utf8Lengths, otherStringSpan.utf8Lengths, allocSize);
}